

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall
wasm::TranslateToFuzzReader::makeBreak(TranslateToFuzzReader *this,Type type)

{
  pointer *pppEVar1;
  FunctionCreationContext *pFVar2;
  bool bVar3;
  value_type *ppEVar4;
  Type TVar5;
  Loop *pLVar6;
  Expression *pEVar7;
  Break *pBVar8;
  TranslateToFuzzReader *this_00;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  Name name;
  Name NVar12;
  Expression *local_60;
  long local_58;
  uintptr_t local_50;
  size_t local_48;
  Expression *local_40;
  TranslateToFuzzReader *local_38;
  
  pFVar2 = this->funcContext;
  if ((pFVar2->breakableStack).
      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (pFVar2->breakableStack).
      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pEVar7 = makeTrivial(this,type);
    return pEVar7;
  }
  if (type.id == 1) {
    local_40 = (Expression *)0x0;
  }
  else {
    local_60 = (Expression *)0x0;
    std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
    emplace_back<wasm::Expression*>
              ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&pFVar2->hangStack,
               &local_60);
    local_40 = makeCondition(this);
  }
  iVar9 = (this->fuzzParams->super_FuzzParams).TRIES;
  local_38 = (TranslateToFuzzReader *)&this->random;
  local_50 = type.id;
LAB_001616e9:
  do {
    if (iVar9 < 1) {
      if (type.id != 1) {
        pppEVar1 = &(this->funcContext->hangStack).
                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppEVar1 = *pppEVar1 + -1;
      }
      pEVar7 = makeTrivial(this,type);
      return pEVar7;
    }
    iVar9 = iVar9 + -1;
    this_00 = local_38;
    ppEVar4 = Random::pick<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                        ((Random *)local_38,&this->funcContext->breakableStack);
    pEVar7 = *ppEVar4;
    NVar12 = getTargetName(this_00,pEVar7);
    local_48 = NVar12.super_IString.str._M_len;
    TVar5 = getTargetType(this_00,pEVar7);
    if (type.id < 2) {
      if (type.id == 0) {
        if (TVar5.id == 0) {
          pEVar7 = (Expression *)0x0;
          goto LAB_0016185d;
        }
      }
      else if (TVar5.id == 0) {
        uVar11 = (ulong)((long)(this->funcContext->hangStack).
                               super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->funcContext->hangStack).
                              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffffffff;
        local_58 = 0;
LAB_0016175b:
        uVar10 = uVar11 & 0xffffffff;
        do {
          uVar11 = uVar11 - 1;
          if ((int)uVar10 < 1) {
LAB_001617a3:
            type.id = local_50;
            if (local_58 == 1) {
              bVar3 = Random::oneIn((Random *)local_38,2);
              type.id = local_50;
            }
            else {
              if (local_58 != 0) {
                bVar3 = Random::oneIn((Random *)local_38,(int)local_58 + 1);
                if (!bVar3) goto LAB_001617f9;
                break;
              }
              bVar3 = Random::oneIn((Random *)local_38,4);
            }
            if (bVar3) {
LAB_001617f9:
              NVar12.super_IString.str._M_len = local_48;
              pBVar8 = Builder::makeBreak(&this->builder,NVar12,(Expression *)0x0,(Expression *)0x0)
              ;
              return (Expression *)pBVar8;
            }
            break;
          }
          pEVar7 = (this->funcContext->hangStack).
                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar11];
          if (pEVar7 == (Expression *)0x0) goto LAB_0016178f;
          pLVar6 = Expression::cast<wasm::Loop>(pEVar7);
          if ((pLVar6 != (Loop *)0x0) &&
             ((pLVar6->name).super_IString.str._M_str == NVar12.super_IString.str._M_str))
          goto LAB_001617a3;
          uVar10 = (ulong)((int)uVar10 - 1);
        } while( true );
      }
      goto LAB_001616e9;
    }
    if (TVar5.id == type.id) {
      pEVar7 = make(this,type);
LAB_0016185d:
      name.super_IString.str._M_str = NVar12.super_IString.str._M_str;
      name.super_IString.str._M_len = local_48;
      pBVar8 = Builder::makeBreak(&this->builder,name,pEVar7,local_40);
      pppEVar1 = &(this->funcContext->hangStack).
                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppEVar1 = *pppEVar1 + -1;
      return (Expression *)pBVar8;
    }
  } while( true );
LAB_0016178f:
  local_58 = local_58 + 1;
  goto LAB_0016175b;
}

Assistant:

Expression* TranslateToFuzzReader::makeBreak(Type type) {
  if (funcContext->breakableStack.empty()) {
    return makeTrivial(type);
  }
  Expression* condition = nullptr;
  if (type != Type::unreachable) {
    funcContext->hangStack.push_back(nullptr);
    condition = makeCondition();
  }
  // we need to find a proper target to break to; try a few times
  int tries = fuzzParams->TRIES;
  while (tries-- > 0) {
    auto* target = pick(funcContext->breakableStack);
    auto name = getTargetName(target);
    auto valueType = getTargetType(target);
    if (type.isConcrete()) {
      // we are flowing out a value
      if (valueType != type) {
        // we need to break to a proper place
        continue;
      }
      auto* ret = builder.makeBreak(name, make(type), condition);
      funcContext->hangStack.pop_back();
      return ret;
    } else if (type == Type::none) {
      if (valueType != Type::none) {
        // we need to break to a proper place
        continue;
      }
      auto* ret = builder.makeBreak(name, nullptr, condition);
      funcContext->hangStack.pop_back();
      return ret;
    } else {
      assert(type == Type::unreachable);
      if (valueType != Type::none) {
        // we need to break to a proper place
        continue;
      }
      // we are about to make an *un*conditional break. if it is
      // to a loop, we prefer there to be a condition along the
      // way, to reduce the chance of infinite looping
      size_t conditions = 0;
      int i = funcContext->hangStack.size();
      while (--i >= 0) {
        auto* item = funcContext->hangStack[i];
        if (item == nullptr) {
          conditions++;
        } else if (auto* loop = item->cast<Loop>()) {
          if (loop->name == name) {
            // we found the target, no more conditions matter
            break;
          }
        }
      }
      switch (conditions) {
        case 0: {
          if (!oneIn(4)) {
            continue;
          }
          break;
        }
        case 1: {
          if (!oneIn(2)) {
            continue;
          }
          break;
        }
        default: {
          if (oneIn(conditions + 1)) {
            continue;
          }
        }
      }
      return builder.makeBreak(name);
    }
  }
  // we failed to find something
  if (type != Type::unreachable) {
    funcContext->hangStack.pop_back();
  }
  return makeTrivial(type);
}